

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,ByteData256 *parent_chain_code,
          uint8_t parent_depth,uint32_t child_num)

{
  bool bVar1;
  CfdException *pCVar2;
  undefined4 uVar3;
  int ret;
  allocator local_261;
  string local_260;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_240;
  Pubkey *local_238;
  ByteData256 *local_230;
  Pubkey key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1b0 [8];
  string local_f0;
  uint8_t local_bc;
  undefined1 local_b1;
  undefined1 local_8c [20];
  undefined4 local_78;
  undefined1 local_71 [65];
  
  ByteData::ByteData(&this->serialize_data_);
  this->child_num_ = 0;
  local_230 = &this->chaincode_;
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  ByteData256::ByteData256(local_230);
  local_238 = &this->pubkey_;
  Pubkey::Pubkey(local_238);
  local_240 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->tweak_sum_;
  ByteData256::ByteData256((ByteData256 *)local_240);
  bVar1 = Pubkey::IsValid(parent_key);
  if (!bVar1) {
    local_f0._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_f0._M_string_length._0_4_ = 0x339;
    local_f0.field_2._M_allocated_capacity = (long)"GetExtPubkey" + 3;
    logger::warn<>((CfdSourceLocation *)&local_f0,"invalid pubkey.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_f0,"Failed to pubkey. ExtPubkey invalid pubkey.",
               (allocator *)local_1b0);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_f0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)parent_key);
  bVar1 = Pubkey::IsCompress(&key);
  if (!bVar1) {
    Pubkey::Compress((Pubkey *)&local_f0,&key);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
  }
  uVar3 = 0x43587cf;
  if (network_type == kMainnet) {
    uVar3 = 0x488b21e;
  }
  if (network_type == kLiquidV1) {
    uVar3 = 0x488b21e;
  }
  memset(&local_f0,0,0xc0);
  local_b1 = 1;
  local_bc = parent_depth;
  local_78 = uVar3;
  Pubkey::GetData((ByteData *)local_1b0,&key);
  ByteData::GetBytes(&pubkey_bytes,(ByteData *)local_1b0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(local_1b0);
  HashUtil::Hash160((ByteData160 *)local_1b0,&key);
  ByteData160::GetBytes(&pubkey_hash,(ByteData160 *)local_1b0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(local_1b0);
  ByteData256::GetData((ByteData *)local_1b0,parent_chain_code);
  ByteData::GetBytes(&chain_bytes,(ByteData *)local_1b0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(local_1b0);
  memcpy(local_71,pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  memcpy(local_8c,pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memcpy(&local_f0,
         chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_start);
  memset(local_1b0,0,0xc0);
  ret = bip32_key_from_parent(&local_f0,child_num,1,local_1b0);
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,0x4e,
               (allocator_type *)&local_260);
    ret = bip32_key_serialize(local_1b0,1,
                              data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (ret == 0) {
      ByteData::ByteData((ByteData *)&local_260,&data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_260);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_260);
      ByteData256::ByteData256((ByteData256 *)&local_260);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(local_240);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_260);
      AnalyzeBip32KeyData(local_1b0,(string *)0x0,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                          &this->version_,&this->depth_,&this->child_num_,local_230,(Privkey *)0x0,
                          local_238,&this->fingerprint_);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      return;
    }
    local_260._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
    local_260._M_string_length._0_4_ = 0x362;
    local_260.field_2._M_allocated_capacity = (long)"GetExtPubkey" + 3;
    logger::warn<int&>((CfdSourceLocation *)&local_260,"bip32_key_serialize error. ret={}",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&local_260,"ExtPrivkey serialize error.",&local_261);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_260);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_260._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_260._M_string_length._0_4_ = 0x359;
  local_260.field_2._M_allocated_capacity = (long)"GetExtPubkey" + 3;
  logger::warn<int&>((CfdSourceLocation *)&local_260,"bip32_key_from_parent error. ret={}",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_260,"ExtPubkey generatekey error.",(allocator *)&data);
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_260);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key,
    const ByteData256& parent_chain_code, uint8_t parent_depth,
    uint32_t child_num) {
  if (!parent_key.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid pubkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to pubkey. ExtPubkey invalid pubkey.");
  }
  Pubkey key = parent_key;
  if (!key.IsCompress()) {
    key = key.Compress();
  }

  // create simple parent data
  struct ext_key parent = {};
  memset(&parent, 0, sizeof(parent));
  parent.version = kVersionTestnetPubkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    parent.version = kVersionMainnetPubkey;
  }
  parent.depth = parent_depth;
  parent.priv_key[0] = BIP32_FLAG_KEY_PUBLIC;
  std::vector<uint8_t> pubkey_bytes = key.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(key).GetBytes();
  std::vector<uint8_t> chain_bytes = parent_chain_code.GetData().GetBytes();
  memcpy(parent.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  memcpy(parent.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(parent.chain_code, chain_bytes.data(), chain_bytes.size());

  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  int ret = bip32_key_from_parent(
      &parent, child_num, BIP32_FLAG_KEY_PUBLIC, &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPubkey generatekey error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PUBLIC, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      nullptr, &pubkey_, &fingerprint_);
}